

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

bool __thiscall
pbrt::DisplayItem::ImageChannelBuffer::SendIfChanged
          (ImageChannelBuffer *this,IPCChannel *ipcChannel,int tileIndex)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  span<unsigned_char> *psVar4;
  reference pvVar5;
  int in_EDX;
  uchar *in_RSI;
  span<const_unsigned_char> *in_RDI;
  IPCChannel *in_stack_00000008;
  span<const_unsigned_char> in_stack_00000010;
  uint64_t hash;
  int excess;
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  span<unsigned_char> *v;
  bool local_1;
  
  iVar2 = (int)in_RDI[3].n + -0x4000;
  if (0 < iVar2) {
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a8689);
    memset(puVar3 + (long)(int)in_RDI[3].n * 4 + (long)*(int *)((long)&in_RDI[1].n + 4),0,
           (long)iVar2 << 2);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a86bd);
  psVar4 = (span<unsigned_char> *)
           HashBuffer(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x4a86da);
  v = psVar4;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2),
                      (long)in_EDX);
  if (v == (span<unsigned_char> *)*pvVar5) {
    local_1 = true;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a8727);
    pstd::MakeSpan<unsigned_char>(in_RSI,in_stack_ffffffffffffff98);
    pstd::span<unsigned_char_const>::span<pstd::span<unsigned_char>,void,pstd::span<unsigned_char>>
              (in_RDI,v);
    bVar1 = IPCChannel::Send(in_stack_00000008,in_stack_00000010);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2),
                          (long)in_EDX);
      *pvVar5 = (value_type)psVar4;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool DisplayItem::ImageChannelBuffer::SendIfChanged(IPCChannel &ipcChannel,
                                                    int tileIndex) {
    int excess = setCount - tileSize * tileSize;
    if (excess > 0)
        memset(buffer.data() + channelValuesOffset + setCount * sizeof(float), 0,
               excess * sizeof(float));

    uint64_t hash = HashBuffer(buffer.data() + channelValuesOffset,
                               tileSize * tileSize * sizeof(float));
    if (hash == tileHashes[tileIndex])
        return true;

    if (!ipcChannel.Send(pstd::MakeSpan(buffer.data(),
                                        channelValuesOffset + setCount * sizeof(float))))
        return false;

    tileHashes[tileIndex] = hash;
    return true;
}